

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O2

ByteData256 * __thiscall
cfd::TransactionContext::CreateSignatureHashByTaproot
          (ByteData256 *__return_storage_ptr__,TransactionContext *this,OutPoint *outpoint,
          SigHashType *sighash_type,ByteData256 *tap_leaf_hash,uint32_t *code_separator_position,
          ByteData *annex)

{
  ByteData256 *__x;
  ByteData256 *pBVar1;
  bool bVar2;
  uint uVar3;
  undefined4 uVar4;
  long lVar5;
  CfdException *this_00;
  ulong uVar6;
  TapScriptData *this_01;
  allocator local_5f1;
  uint32_t *local_5f0;
  SigHashType *local_5e8;
  ByteData256 *local_5e0;
  ByteData256 *local_5d8;
  OutPoint *local_5d0;
  vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> utxos;
  SigHashType local_5a4 [12];
  TapScriptData script_data;
  ByteData annex_data;
  UtxoData utxo;
  
  local_5f0 = code_separator_position;
  local_5e8 = sighash_type;
  local_5e0 = tap_leaf_hash;
  local_5d8 = __return_storage_ptr__;
  local_5d0 = outpoint;
  UtxoData::UtxoData(&utxo);
  utxos.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  utxos.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  utxos.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar6 = 0;
  while( true ) {
    lVar5 = *(long *)&this->field_0x18 - *(long *)&this->field_0x10;
    if ((ulong)(lVar5 / 0x90) <= uVar6) {
      uVar4 = (**(code **)(*(long *)this + 0x78))(this,local_5d0,lVar5 % 0x90);
      cfd::core::ByteData::ByteData(&annex_data);
      pBVar1 = local_5d8;
      __x = local_5e0;
      if (annex != (ByteData *)0x0) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (&annex_data.data_,&annex->data_);
      }
      this_01 = &script_data;
      core::TapScriptData::TapScriptData(this_01);
      if (__x != (ByteData256 *)0x0) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&script_data,&__x->data_
                  );
        if (local_5f0 != (uint32_t *)0x0) {
          script_data.code_separator_position = *local_5f0;
        }
      }
      cfd::core::SigHashType::SigHashType(local_5a4,local_5e8);
      if (__x == (ByteData256 *)0x0) {
        this_01 = (TapScriptData *)0x0;
      }
      cfd::core::Transaction::GetSchnorrSignatureHash
                (pBVar1,this,uVar4,local_5a4,&utxos,this_01,&annex_data);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&script_data);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&annex_data);
      std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::~vector(&utxos);
      UtxoData::~UtxoData(&utxo);
      return pBVar1;
    }
    cfd::core::AbstractTxIn::GetTxid();
    uVar3 = cfd::core::AbstractTxIn::GetVout();
    cfd::core::OutPoint::OutPoint((OutPoint *)&annex_data,(Txid *)&script_data,uVar3);
    core::Txid::~Txid((Txid *)&script_data);
    bVar2 = IsFindUtxoMap(this,(OutPoint *)&annex_data,&utxo);
    if (!bVar2) break;
    GetLockingScriptFromUtxoData((Script *)&script_data,&utxo);
    cfd::core::Script::operator=(&utxo.locking_script,(Script *)&script_data);
    core::Script::~Script((Script *)&script_data);
    cfd::core::TxOut::TxOut((TxOut *)&script_data,&utxo.amount,&utxo.locking_script);
    std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::emplace_back<cfd::core::TxOut>
              (&utxos,(TxOut *)&script_data);
    core::AbstractTxOut::~AbstractTxOut((AbstractTxOut *)&script_data);
    core::Txid::~Txid((Txid *)&annex_data);
    uVar6 = uVar6 + 1;
  }
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&script_data,"Utxo is not found. CreateSignatureHashByTaproot fail.",
             &local_5f1);
  core::CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)&script_data);
  __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

ByteData256 TransactionContext::CreateSignatureHashByTaproot(
    const OutPoint& outpoint, const SigHashType& sighash_type,
    const ByteData256* tap_leaf_hash, const uint32_t* code_separator_position,
    const ByteData* annex) const {
  UtxoData utxo;
  std::vector<TxOut> utxos;
  // utxos.reserve(vin_.size());
  // for (const auto& txin_ref : vin_) {
  for (size_t index = 0; index < vin_.size(); ++index) {
    const auto& txin_ref = vin_[index];
    OutPoint target_outpoint(txin_ref.GetTxid(), txin_ref.GetVout());
    if (!IsFindUtxoMap(target_outpoint, &utxo)) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Utxo is not found. CreateSignatureHashByTaproot fail.");
    }
    utxo.locking_script = GetLockingScriptFromUtxoData(utxo);
    utxos.emplace_back(TxOut(utxo.amount, utxo.locking_script));
  }

  uint32_t txin_index = GetTxInIndex(outpoint);
  ByteData annex_data;
  if (annex != nullptr) annex_data = *annex;
  TapScriptData script_data;
  if (tap_leaf_hash != nullptr) {
    script_data.tap_leaf_hash = *tap_leaf_hash;
    if (code_separator_position != nullptr) {
      script_data.code_separator_position = *code_separator_position;
    }
  }

  return GetSchnorrSignatureHash(
      txin_index, sighash_type, utxos,
      (tap_leaf_hash != nullptr) ? &script_data : nullptr, annex_data);
}